

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampSOperator>::Insert
          (PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampSOperator> *this,long value)

{
  idx_t iVar1;
  bool bVar2;
  primitive_dictionary_entry_t *this_00;
  PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampSOperator> *in_RSI;
  PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampSOperator> *in_RDI;
  primitive_dictionary_entry_t *entry;
  long *in_stack_ffffffffffffffe8;
  PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampSOperator> *this_01;
  
  if ((in_RDI->full & 1U) == 0) {
    this_01 = in_RDI;
    this_00 = Lookup(in_RSI,in_stack_ffffffffffffffe8);
    bVar2 = primitive_dictionary_entry_t::IsEmpty(this_00);
    if (bVar2) {
      if ((in_RDI->maximum_size < in_RDI->size + 1) ||
         (bVar2 = AddToTarget<long,_0>(this_01,(long *)in_RSI), !bVar2)) {
        in_RDI->full = true;
      }
      else {
        this_00->value = (long)in_RSI;
        iVar1 = in_RDI->size;
        in_RDI->size = iVar1 + 1;
        this_00->index = (uint32_t)iVar1;
      }
    }
  }
  return;
}

Assistant:

void Insert(SRC value) {
		if (full) {
			return;
		}
		auto &entry = Lookup(value);
		if (entry.IsEmpty()) {
			if (size + 1 > maximum_size || !AddToTarget(value)) {
				full = true;
				return;
			}
			entry.value = value;
			entry.index = size++;
		}
	}